

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hsort_template.h
# Opt level: O0

void ON_hsort_double(double *base,size_t nel)

{
  size_t sVar1;
  double local_58;
  double tmp;
  double *e_j;
  double *e_i;
  double *e_end;
  size_t j;
  size_t i;
  size_t k;
  size_t i_end;
  size_t nel_local;
  double *base_local;
  
  if ((base != (double *)0x0) && (1 < nel)) {
    i = nel >> 1;
    k = nel - 1;
    e_i = base + k;
    do {
      if (i == 0) {
        local_58 = *e_i;
        *e_i = *base;
        k = k - 1;
        if (k == 0) {
          *base = local_58;
          return;
        }
        e_i = e_i + -1;
      }
      else {
        i = i - 1;
        local_58 = base[i];
      }
      e_j = base + i;
      sVar1 = i * 2;
      while (e_end = (double *)(sVar1 + 1), e_end <= k) {
        tmp = (double)(base + (long)e_end);
        if ((e_end < k) &&
           (*(double *)tmp <= *(double *)((long)tmp + 8) &&
            *(double *)((long)tmp + 8) != *(double *)tmp)) {
          e_end = (double *)(sVar1 + 2);
          tmp = (double)((long)tmp + 8);
        }
        sVar1 = k;
        if (local_58 < *(double *)tmp) {
          *e_j = *(double *)tmp;
          e_j = (double *)tmp;
          sVar1 = (long)e_end * 2;
        }
      }
      *e_j = local_58;
    } while( true );
  }
  return;
}

Assistant:

void
ON_HSORT_FNAME( ON_SORT_TEMPLATE_TYPE* base, size_t nel )
{
  size_t i_end,k,i,j;
  ON_SORT_TEMPLATE_TYPE* e_end;
  ON_SORT_TEMPLATE_TYPE* e_i;
  ON_SORT_TEMPLATE_TYPE* e_j;
  ON_SORT_TEMPLATE_TYPE tmp;

  if (0 == base || nel < 2)
    return;

  k = nel >> 1;
  i_end = nel-1;
  e_end = base + i_end;
  for (;;) 
  {
    if (k)
    {
      --k;
      ON_HSORT_TO_TMP((base+k));  /* e_tmp = e[k]; */
    } 
    else
    {      
      ON_HSORT_TO_TMP(e_end);     /* e_tmp = e[i_end]; */
      ON_HSORT_COPY(e_end,base);  /* e[i_end] = e[0];  */
      if (!(--i_end))
      {
        ON_HSORT_FROM_TMP(base);  /* e[0] = e_tmp;     */
        break;
      }
      e_end--;
    }

    i = k;
    j = (k<<1) + 1;
    e_i = base + i;
    while (j <= i_end) 
    {
      e_j = base + j;
      if (j < i_end && ON_HSORT_GT((e_j+1),e_j) /*e[j] < e[j + 1] */)
      {
        j++;
        e_j++;
      }
      if (ON_HSORT_GT_TMP(e_j) /* tmp < e[j] */) 
      {
        ON_HSORT_COPY(e_i,e_j);  /* e[i] = e[j]; */
        i = j;
        e_i = e_j;
        j = (j<<1) + 1;
      }
      else
        j = i_end + 1;
    }

    ON_HSORT_FROM_TMP(e_i); /* e[i] = e_tmp; */
  }
}